

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gesture_acts.cpp
# Opt level: O0

ostream * operator<<(ostream *os,datarow *dr)

{
  ostream *poVar1;
  datarow *dr_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"datarow<ACC(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dr->acc_x);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dr->acc_y);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dr->acc_z);
  poVar1 = std::operator<<(poVar1,"), GYR(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dr->gyr_x);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dr->gyr_y);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dr->gyr_z);
  poVar1 = std::operator<<(poVar1,"), t(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dr->timestamp);
  std::operator<<(poVar1,")>");
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const datarow &dr){
    os << "datarow<ACC(" << dr.acc_x << ", " << dr.acc_y << ", " << dr.acc_z << "), GYR("
       << dr.gyr_x << ", " << dr.gyr_y << ", " << dr.gyr_z << "), t(" << dr.timestamp << ")>";
    return os;
}